

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dleq_impl.h
# Opt level: O0

int secp256k1_dleq_verify
              (secp256k1_ecmult_context *ecmult_ctx,uchar *algo16,secp256k1_scalar *s,
              secp256k1_scalar *e,secp256k1_ge *p1,secp256k1_ge *gen2,secp256k1_ge *p2)

{
  int iVar1;
  undefined1 local_428 [8];
  secp256k1_gej tmpj;
  secp256k1_ge r2;
  secp256k1_ge r1;
  secp256k1_gej r2j;
  secp256k1_gej r1j;
  secp256k1_gej p2j;
  secp256k1_gej p1j;
  secp256k1_gej gen2j;
  secp256k1_scalar e_expected;
  secp256k1_scalar e_neg;
  secp256k1_ge *gen2_local;
  secp256k1_ge *p1_local;
  secp256k1_scalar *e_local;
  secp256k1_scalar *s_local;
  uchar *algo16_local;
  secp256k1_ecmult_context *ecmult_ctx_local;
  
  secp256k1_gej_set_ge((secp256k1_gej *)&p2j.infinity,p1);
  secp256k1_gej_set_ge((secp256k1_gej *)&r1j.infinity,p2);
  secp256k1_scalar_negate((secp256k1_scalar *)(e_expected.d + 3),e);
  secp256k1_ecmult(ecmult_ctx,(secp256k1_gej *)&r2j.infinity,(secp256k1_gej *)&p2j.infinity,
                   (secp256k1_scalar *)(e_expected.d + 3),s);
  secp256k1_ecmult(ecmult_ctx,(secp256k1_gej *)local_428,(secp256k1_gej *)&r1j.infinity,
                   (secp256k1_scalar *)(e_expected.d + 3),&secp256k1_scalar_zero);
  secp256k1_gej_set_ge((secp256k1_gej *)&p1j.infinity,gen2);
  secp256k1_ecmult(ecmult_ctx,(secp256k1_gej *)&r1.infinity,(secp256k1_gej *)&p1j.infinity,s,
                   &secp256k1_scalar_zero);
  secp256k1_gej_add_var
            ((secp256k1_gej *)&r1.infinity,(secp256k1_gej *)&r1.infinity,(secp256k1_gej *)local_428,
             (secp256k1_fe *)0x0);
  secp256k1_ge_set_gej((secp256k1_ge *)&r2.infinity,(secp256k1_gej *)&r2j.infinity);
  secp256k1_ge_set_gej((secp256k1_ge *)&tmpj.infinity,(secp256k1_gej *)&r1.infinity);
  secp256k1_dleq_challenge_hash
            ((secp256k1_scalar *)&gen2j.infinity,algo16,gen2,(secp256k1_ge *)&r2.infinity,
             (secp256k1_ge *)&tmpj.infinity,p1,p2);
  secp256k1_scalar_add
            ((secp256k1_scalar *)&gen2j.infinity,(secp256k1_scalar *)&gen2j.infinity,
             (secp256k1_scalar *)(e_expected.d + 3));
  iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)&gen2j.infinity);
  return iVar1;
}

Assistant:

static int secp256k1_dleq_verify(const secp256k1_ecmult_context *ecmult_ctx, const unsigned char *algo16, const secp256k1_scalar *s, const secp256k1_scalar *e, const secp256k1_ge *p1, const secp256k1_ge *gen2, const secp256k1_ge *p2) {
    secp256k1_scalar e_neg;
    secp256k1_scalar e_expected;
    secp256k1_gej gen2j;
    secp256k1_gej p1j, p2j;
    secp256k1_gej r1j, r2j;
    secp256k1_ge r1, r2;
    secp256k1_gej tmpj;

    secp256k1_gej_set_ge(&p1j, p1);
    secp256k1_gej_set_ge(&p2j, p2);

    secp256k1_scalar_negate(&e_neg, e);
    /* R1 = s*G  - e*P1 */
    secp256k1_ecmult(ecmult_ctx, &r1j, &p1j, &e_neg, s);
    /* R2 = s*gen2 - e*P2 */
    secp256k1_ecmult(ecmult_ctx, &tmpj, &p2j, &e_neg, &secp256k1_scalar_zero);
    secp256k1_gej_set_ge(&gen2j, gen2);
    secp256k1_ecmult(ecmult_ctx, &r2j, &gen2j, s, &secp256k1_scalar_zero);
    secp256k1_gej_add_var(&r2j, &r2j, &tmpj, NULL);

    secp256k1_ge_set_gej(&r1, &r1j);
    secp256k1_ge_set_gej(&r2, &r2j);
    secp256k1_dleq_challenge_hash(&e_expected, algo16, gen2, &r1, &r2, p1, p2);

    secp256k1_scalar_add(&e_expected, &e_expected, &e_neg);
    return secp256k1_scalar_is_zero(&e_expected);
}